

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  thread t2;
  thread t1;
  EventCount eventCount;
  thread local_28;
  thread local_20;
  EventCount *local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_28._M_id._M_thread = (id)(id)&local_10;
  std::thread::thread<void(&)(EventCount*),EventCount*,void>
            (&local_20,waiter,(EventCount **)&local_28);
  usleep(1);
  local_18 = (EventCount *)&local_10;
  std::thread::thread<void(&)(EventCount*),EventCount*,void>(&local_28,notifier,&local_18);
  std::thread::join();
  std::thread::join();
  if ((local_28._M_id._M_thread == 0) && (local_20._M_id._M_thread == 0)) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main(int argc, char **argv) {

    EventCount eventCount;

    std::thread t1(waiter, &eventCount);
    usleep(1);
    std::thread t2(notifier, &eventCount);

    t1.join();
    t2.join();

    return 0;
}